

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

ExprPtr __thiscall pegmatite::operator____E(pegmatite *this,char *x,size_t len)

{
  Expr *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExprPtr EVar1;
  allocator_type local_21;
  
  __p = (Expr *)operator_new(0x20);
  __p->_vptr_Expr = (_func_int **)&PTR__StringExpr_00165d30;
  std::vector<char32_t,std::allocator<char32_t>>::vector<char_const*,void>
            ((vector<char32_t,std::allocator<char32_t>> *)(__p + 1),x,x + len,&local_21);
  std::__shared_ptr<pegmatite::Expr,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pegmatite::Expr,void>
            ((__shared_ptr<pegmatite::Expr,(__gnu_cxx::_Lock_policy)2> *)this,__p);
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ExprPtr)EVar1.super_shared_ptr<pegmatite::Expr>.
                  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr operator "" _E(const char *x, std::size_t len)
{
	return ExprPtr(new StringExpr(x, len));
}